

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int SSL_CTX_use_certificate_chain_blob(SSL_CTX *ctx,curl_blob *blob,char *key_passwd)

{
  int iVar1;
  BIO *bp;
  X509 *x_00;
  ulong uVar2;
  long lVar3;
  X509 *a;
  sslerr_t err;
  X509 *ca;
  BIO *in;
  void *passwd_callback_userdata;
  X509 *x;
  int ret;
  char *key_passwd_local;
  curl_blob *blob_local;
  SSL_CTX *ctx_local;
  
  bp = BIO_new_mem_buf(blob->data,(int)blob->len);
  if (bp == (BIO *)0x0) {
    ctx_local._4_4_ = 0x1b;
  }
  else {
    ERR_clear_error();
    x_00 = PEM_read_bio_X509_AUX(bp,(X509 **)0x0,passwd_callback,key_passwd);
    if (x_00 == (X509 *)0x0) {
      x._4_4_ = 0;
    }
    else {
      x._4_4_ = SSL_CTX_use_certificate((SSL_CTX *)ctx,x_00);
      uVar2 = ERR_peek_error();
      if (uVar2 != 0) {
        x._4_4_ = 0;
      }
      if (x._4_4_ != 0) {
        lVar3 = SSL_CTX_ctrl((SSL_CTX *)ctx,0x58,0,(void *)0x0);
        if (lVar3 == 0) {
          x._4_4_ = 0;
        }
        else {
          do {
            a = PEM_read_bio_X509(bp,(X509 **)0x0,passwd_callback,key_passwd);
            if (a == (X509 *)0x0) {
              uVar2 = ERR_peek_last_error();
              iVar1 = ERR_GET_LIB(uVar2);
              if ((iVar1 == 9) && (iVar1 = ERR_GET_REASON(uVar2), iVar1 == 0x6c)) {
                ERR_clear_error();
              }
              else {
                x._4_4_ = 0;
              }
              goto LAB_001b59aa;
            }
            lVar3 = SSL_CTX_ctrl((SSL_CTX *)ctx,0x59,0,a);
          } while (lVar3 != 0);
          X509_free(a);
          x._4_4_ = 0;
        }
      }
    }
LAB_001b59aa:
    X509_free(x_00);
    BIO_free(bp);
    ctx_local._4_4_ = x._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

static int
SSL_CTX_use_certificate_chain_blob(SSL_CTX *ctx, const struct curl_blob *blob,
                                   const char *key_passwd)
{
/* SSL_CTX_add1_chain_cert introduced in OpenSSL 1.0.2 */
#if (OPENSSL_VERSION_NUMBER >= 0x1000200fL) && /* OpenSSL 1.0.2 or later */ \
  !(defined(LIBRESSL_VERSION_NUMBER) &&                                     \
    (LIBRESSL_VERSION_NUMBER < 0x2090100fL)) /* LibreSSL 2.9.1 or later */
  int ret = 0;
  X509 *x = NULL;
  void *passwd_callback_userdata = (void *)key_passwd;
  BIO *in = BIO_new_mem_buf(blob->data, (int)(blob->len));
  if(!in)
    return CURLE_OUT_OF_MEMORY;

  ERR_clear_error();

  x = PEM_read_bio_X509_AUX(in, NULL,
                            passwd_callback, (void *)key_passwd);

  if(!x) {
    ret = 0;
    goto end;
  }

  ret = SSL_CTX_use_certificate(ctx, x);

  if(ERR_peek_error() != 0)
    ret = 0;

  if(ret) {
    X509 *ca;
    sslerr_t err;

    if(!SSL_CTX_clear_chain_certs(ctx)) {
      ret = 0;
      goto end;
    }

    while((ca = PEM_read_bio_X509(in, NULL, passwd_callback,
                                  passwd_callback_userdata))
          != NULL) {

      if(!SSL_CTX_add0_chain_cert(ctx, ca)) {
        X509_free(ca);
        ret = 0;
        goto end;
      }
    }

    err = ERR_peek_last_error();
    if((ERR_GET_LIB(err) == ERR_LIB_PEM) &&
       (ERR_GET_REASON(err) == PEM_R_NO_START_LINE))
      ERR_clear_error();
    else
      ret = 0;
  }

end:
  X509_free(x);
  BIO_free(in);
  return ret;
#else
  (void)ctx; /* unused */
  (void)blob; /* unused */
  (void)key_passwd; /* unused */
  return 0;
#endif
}